

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedConditionalDispatching::Method_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n1. Render two quads. One will pass depth-test and the second one will not.\n2. Use GL_ANY_SAMPLES_PASSED query objects to \'remember\' these results.\n3. Use DispatchCompute and DispatchComputeIndirect commands inside conditional blocks using both query objects.\n4. Verify that DispatchCompute and DispatchComputeIndirect commands are only executed in\n    the conditional block that uses query object that has passed depth-test."
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Method()
	{
		return NL "1. Render two quads. One will pass depth-test and the second one will not." NL
				  "2. Use GL_ANY_SAMPLES_PASSED query objects to 'remember' these results." NL
				  "3. Use DispatchCompute and DispatchComputeIndirect commands inside conditional blocks using both "
				  "query objects." NL
				  "4. Verify that DispatchCompute and DispatchComputeIndirect commands are only executed in" NL
				  "    the conditional block that uses query object that has passed depth-test.";
	}